

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigopcount_tests.cpp
# Opt level: O1

void __thiscall sigopcount_tests::GetTxSigOpCost::test_method(GetTxSigOpCost *this)

{
  uint uVar1;
  uint256 *puVar2;
  base_blob<256U> *pbVar3;
  ScriptError SVar4;
  uint uVar5;
  CScript *pCVar6;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar7;
  int64_t iVar8;
  undefined8 uVar9;
  uint32_t flags;
  uint32_t flags_00;
  uint32_t flags_01;
  uint32_t flags_02;
  uint32_t flags_03;
  uint32_t flags_04;
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *p_Var10;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar11;
  const_iterator __first;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  span<const_std::byte,_18446744073709551615UL> b_02;
  span<const_std::byte,_18446744073709551615UL> b_03;
  span<const_std::byte,_18446744073709551615UL> b_04;
  span<const_std::byte,_18446744073709551615UL> b_05;
  span<const_std::byte,_18446744073709551615UL> b_06;
  span<const_std::byte,_18446744073709551615UL> b_07;
  span<const_std::byte,_18446744073709551615UL> b_08;
  span<const_std::byte,_18446744073709551615UL> b_09;
  CScriptWitness scriptWitness_3;
  CKey key;
  CCoinsView coinsDummy;
  CMutableTransaction spendingTx;
  CMutableTransaction creationTx;
  CScriptWitness scriptWitness_2;
  CScript scriptSig_1;
  CScript scriptSig;
  CScript scriptPubKey;
  CPubKey pubkey;
  CCoinsViewCache coins;
  iterator local_3e0;
  CScriptWitness local_3d8;
  undefined1 local_3c0 [8];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_3b8;
  CCoinsView local_3b0;
  CMutableTransaction local_3a8;
  CMutableTransaction local_370;
  direct_or_indirect local_338;
  uint local_31c;
  undefined1 local_318 [24];
  undefined8 uStack_300;
  undefined1 local_2f8 [72];
  uchar local_2b0;
  undefined1 local_278 [28];
  uint uStack_25c;
  direct_or_indirect local_250;
  uint local_234;
  CPubKey local_229;
  CCoinsViewCache local_1e8;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&local_370);
  CMutableTransaction::CMutableTransaction(&local_3a8);
  local_3b0._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_013bb510;
  CCoinsViewCache::CCoinsViewCache(&local_1e8,&local_3b0,false);
  GenerateRandomKey(SUB81((CKey *)local_3c0,0));
  CKey::GetPubKey(&local_229,(CKey *)local_3c0);
  local_2f8._16_8_ = 0;
  local_2f8._24_8_ = (pointer)0x0;
  local_2f8._0_8_ = (char *)0x0;
  local_2f8._8_8_ = 0;
  local_278[0] = 0x51;
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)local_2f8,local_278);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278,&local_229);
  b._M_extent._M_extent_value = local_278._8_8_ - local_278._0_8_;
  b._M_ptr = (pointer)local_278._0_8_;
  pCVar6 = CScript::operator<<((CScript *)local_2f8,b);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_318,&local_229);
  b_00._M_extent._M_extent_value = local_318._8_8_ - local_318._0_8_;
  b_00._M_ptr = (pointer)local_318._0_8_;
  ppVar7 = &CScript::operator<<(pCVar6,b_00)->super_CScriptBase;
  local_338.direct[0] = 'R';
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)ppVar7,(uchar *)local_338.direct);
  uVar5 = ppVar7->_size;
  uVar1 = uVar5 - 0x1d;
  if (uVar5 < 0x1d) {
    uVar1 = uVar5;
  }
  ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar7->_union).indirect_contents.indirect;
  if (uVar5 < 0x1d) {
    ppVar11 = ppVar7;
  }
  local_338.direct[0] = 0xaf;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar7,(uchar *)((long)&ppVar11->_union + (long)(int)uVar1),(uchar *)local_338.direct);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_250.indirect_contents,ppVar7
            );
  if ((pointer)local_318._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ - local_318._0_8_);
  }
  if ((pointer)local_278._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ - local_278._0_8_);
  }
  if (0x1c < (uint)local_2f8._28_4_) {
    free((void *)local_2f8._0_8_);
  }
  local_2f8._16_8_ = 0;
  local_2f8._24_8_ = (pointer)0x0;
  local_2f8._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
  local_2f8._8_8_ = 0;
  local_318._0_8_ = local_318._0_8_ & 0xffffffffffffff00;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2f8,(iterator)local_2f8,
             local_318);
  ppVar7 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2f8._0_8_;
  uVar5 = local_2f8._28_4_ - 0x1d;
  if ((uint)local_2f8._28_4_ < 0x1d) {
    ppVar7 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2f8;
    uVar5 = local_2f8._28_4_;
  }
  local_318._0_8_ = local_318._0_8_ & 0xffffffffffffff00;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2f8,
             (uchar *)((long)&ppVar7->_union + (long)(int)uVar5),local_318);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_278,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2f8);
  if (0x1c < (uint)local_2f8._28_4_) {
    free((void *)local_2f8._0_8_);
  }
  local_2f8._0_8_ = (char *)0x0;
  local_2f8._8_8_ = 0;
  local_2f8._16_8_ = 0;
  BuildTxs(&local_3a8,&local_1e8,&local_370,(CScript *)&local_250.indirect_contents,
           (CScript *)local_278,(CScriptWitness *)local_2f8);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)local_2f8);
  CTransaction::CTransaction((CTransaction *)local_2f8,&local_3a8);
  iVar8 = GetTransactionSigOpCost((CTransaction *)local_2f8,&local_1e8,0x801);
  if (iVar8 != 0) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x89,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
  CTransaction::CTransaction((CTransaction *)local_2f8,&local_370);
  iVar8 = GetTransactionSigOpCost((CTransaction *)local_2f8,&local_1e8,0x801);
  if (iVar8 != 0x50) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(creationTx), coins, flags) == MAX_PUBKEYS_PER_MULTISIG * WITNESS_SCALE_FACTOR"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x8c,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
  CTransaction::CTransaction((CTransaction *)local_2f8,&local_370);
  SVar4 = VerifyWithFlag((CTransaction *)local_2f8,&local_3a8,flags);
  if (SVar4 != SCRIPT_ERR_CHECKMULTISIGVERIFY) {
    __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x8e,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
  if (0x1c < uStack_25c) {
    free((void *)local_278._0_8_);
    local_278._0_8_ = (pointer)0x0;
  }
  if (0x1c < local_234) {
    free(local_250.indirect_contents.indirect);
    local_250.indirect_contents.indirect = (char *)0x0;
  }
  local_2f8._16_8_ = 0;
  local_2f8._24_8_ = (pointer)0x0;
  local_2f8._0_8_ = (char *)0x0;
  local_2f8._8_8_ = 0;
  local_278[0] = 0x51;
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)local_2f8,local_278);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278,&local_229);
  b_01._M_extent._M_extent_value = local_278._8_8_ - local_278._0_8_;
  b_01._M_ptr = (pointer)local_278._0_8_;
  pCVar6 = CScript::operator<<((CScript *)local_2f8,b_01);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_318,&local_229);
  b_02._M_extent._M_extent_value = local_318._8_8_ - local_318._0_8_;
  b_02._M_ptr = (pointer)local_318._0_8_;
  ppVar7 = &CScript::operator<<(pCVar6,b_02)->super_CScriptBase;
  local_338.direct[0] = 'R';
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)ppVar7,(uchar *)local_338.direct);
  uVar5 = ppVar7->_size;
  uVar1 = uVar5 - 0x1d;
  if (uVar5 < 0x1d) {
    uVar1 = uVar5;
  }
  ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar7->_union).indirect_contents.indirect;
  if (uVar5 < 0x1d) {
    ppVar11 = ppVar7;
  }
  local_338.direct[0] = 0xaf;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar7,(uchar *)((long)&ppVar11->_union + (long)(int)uVar1),(uchar *)local_338.direct);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_250.indirect_contents,ppVar7
            );
  if ((pointer)local_318._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ - local_318._0_8_);
  }
  if ((pointer)local_278._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ - local_278._0_8_);
  }
  if (0x1c < (uint)local_2f8._28_4_) {
    free((void *)local_2f8._0_8_);
    local_2f8._0_8_ = (char *)0x0;
  }
  ScriptHash::ScriptHash((ScriptHash *)local_318,(CScript *)&local_250.indirect_contents);
  local_2f8._16_4_ = local_318._16_4_;
  local_2f8._0_8_ = local_318._0_8_;
  local_2f8._8_8_ = local_318._8_8_;
  local_2b0 = '\x03';
  GetScriptForDestination((CScript *)local_278,(CTxDestination *)local_2f8);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_2f8);
  local_2f8._16_8_ = 0;
  local_2f8._24_8_ = (pointer)0x0;
  local_2f8._0_8_ =
       (_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        *)0x0;
  local_2f8._8_8_ = 0;
  local_338.indirect_contents.indirect =
       (char *)((ulong)local_338.indirect_contents.indirect & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2f8,(iterator)local_2f8,
             (uchar *)local_338.direct);
  p_Var10 = (_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)local_2f8._0_8_;
  uVar5 = local_2f8._28_4_ - 0x1d;
  if ((uint)local_2f8._28_4_ < 0x1d) {
    p_Var10 = (_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)local_2f8;
    uVar5 = local_2f8._28_4_;
  }
  local_338.indirect_contents.indirect =
       (char *)((ulong)local_338.indirect_contents.indirect & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2f8,
             (uchar *)((long)&p_Var10->_M_u + (long)(int)uVar5),(uchar *)local_338.direct);
  uVar9 = &local_250;
  uVar5 = local_234;
  if (0x1c < local_234) {
    uVar9 = local_250.indirect_contents.indirect;
    uVar5 = local_234 - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_338.indirect_contents,
             (const_iterator)uVar9,(uchar *)(uVar9 + (long)(int)uVar5),(allocator_type *)&local_3d8)
  ;
  b_03._M_extent._M_extent_value = local_338._8_8_ - local_338._0_8_;
  b_03._M_ptr = (pointer)local_338.indirect_contents.indirect;
  ppVar7 = &CScript::operator<<((CScript *)local_2f8,b_03)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_318,ppVar7);
  if ((pointer)local_338.indirect_contents.indirect != (pointer)0x0) {
    operator_delete(local_338.indirect_contents.indirect,local_338._16_8_ - local_338._0_8_);
  }
  if (0x1c < (uint)local_2f8._28_4_) {
    free((void *)local_2f8._0_8_);
  }
  local_2f8._0_8_ = (char *)0x0;
  local_2f8._8_8_ = 0;
  local_2f8._16_8_ = 0;
  BuildTxs(&local_3a8,&local_1e8,&local_370,(CScript *)local_278,(CScript *)local_318,
           (CScriptWitness *)local_2f8);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)local_2f8);
  CTransaction::CTransaction((CTransaction *)local_2f8,&local_3a8);
  iVar8 = GetTransactionSigOpCost((CTransaction *)local_2f8,&local_1e8,0x801);
  if (iVar8 != 8) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2 * WITNESS_SCALE_FACTOR"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x98,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
  CTransaction::CTransaction((CTransaction *)local_2f8,&local_370);
  SVar4 = VerifyWithFlag((CTransaction *)local_2f8,&local_3a8,flags_00);
  if (SVar4 != SCRIPT_ERR_CHECKMULTISIGVERIFY) {
    __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x99,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
  if (0x1c < uStack_300._4_4_) {
    free((void *)local_318._0_8_);
    local_318._0_8_ = (pointer)0x0;
  }
  if (0x1c < uStack_25c) {
    free((void *)local_278._0_8_);
    local_278._0_8_ = (pointer)0x0;
  }
  if (0x1c < local_234) {
    free(local_250.indirect_contents.indirect);
    local_250.indirect_contents.indirect = (char *)0x0;
  }
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)local_278,&local_229);
  local_2f8._16_4_ = local_278._16_4_;
  local_2f8._0_8_ = local_278._0_8_;
  local_2f8._8_8_ = local_278._8_8_;
  local_2b0 = '\x05';
  GetScriptForDestination((CScript *)&local_250.indirect_contents,(CTxDestination *)local_2f8);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_2f8);
  local_278._16_8_ = (pointer)0x0;
  stack0xfffffffffffffda0 = 0;
  local_278._0_8_ = (pointer)0x0;
  local_278._8_8_ = (pointer)0x0;
  local_318._0_8_ = (pointer)0x0;
  local_318._8_8_ = (pointer)0x0;
  local_318._16_8_ = (pointer)0x0;
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_318,(int *)local_2f8);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_318,(int *)local_2f8);
  BuildTxs(&local_3a8,&local_1e8,&local_370,(CScript *)&local_250.indirect_contents,
           (CScript *)local_278,(CScriptWitness *)local_318);
  CTransaction::CTransaction((CTransaction *)local_2f8,&local_3a8);
  iVar8 = GetTransactionSigOpCost((CTransaction *)local_2f8,&local_1e8,0x801);
  if (iVar8 != 1) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xa6,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
  CTransaction::CTransaction((CTransaction *)local_2f8,&local_3a8);
  iVar8 = GetTransactionSigOpCost((CTransaction *)local_2f8,&local_1e8,1);
  if (iVar8 != 0) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags & ~SCRIPT_VERIFY_WITNESS) == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xa8,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
  CTransaction::CTransaction((CTransaction *)local_2f8,&local_370);
  SVar4 = VerifyWithFlag((CTransaction *)local_2f8,&local_3a8,flags_01);
  if (SVar4 != SCRIPT_ERR_EQUALVERIFY) {
    __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_EQUALVERIFY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xa9,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
  uVar9 = &local_250;
  if (0x1c < local_234) {
    uVar9 = local_250.indirect_contents.indirect;
  }
  if ((((CScriptBase *)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar9)->indirect)->
      _union).direct[0] != '\0') {
    __assert_fail("scriptPubKey[0] == 0x00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xac,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  (((CScriptBase *)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar9)->indirect)->_union).
  direct[0] = 'Q';
  BuildTxs(&local_3a8,&local_1e8,&local_370,(CScript *)&local_250.indirect_contents,
           (CScript *)local_278,(CScriptWitness *)local_318);
  CTransaction::CTransaction((CTransaction *)local_2f8,&local_3a8);
  iVar8 = GetTransactionSigOpCost((CTransaction *)local_2f8,&local_1e8,0x801);
  if (iVar8 != 0) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xaf,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
  uVar9 = &local_250;
  if (0x1c < local_234) {
    uVar9 = local_250.indirect_contents.indirect;
  }
  (((CScriptBase *)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar9)->indirect)->_union).
  direct[0] = '\0';
  BuildTxs(&local_3a8,&local_1e8,&local_370,(CScript *)&local_250.indirect_contents,
           (CScript *)local_278,(CScriptWitness *)local_318);
  pbVar3 = &((local_3a8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  pbVar3 = &((local_3a8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  puVar2 = &((local_3a8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped;
  (puVar2->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar3 = &((local_3a8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '\0';
  (pbVar3->m_data)._M_elems[9] = '\0';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  ((local_3a8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0xffffffff;
  CTransaction::CTransaction((CTransaction *)local_2f8,&local_3a8);
  iVar8 = GetTransactionSigOpCost((CTransaction *)local_2f8,&local_1e8,0x801);
  if (iVar8 == 0) {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_318);
    if (0x1c < uStack_25c) {
      free((void *)local_278._0_8_);
      local_278._0_8_ = (pointer)0x0;
    }
    if (0x1c < local_234) {
      free(local_250.indirect_contents.indirect);
      local_250.indirect_contents.indirect = (char *)0x0;
    }
    WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)local_278,&local_229);
    local_2f8._16_4_ = local_278._16_4_;
    local_2f8._0_8_ = local_278._0_8_;
    local_2f8._8_8_ = local_278._8_8_;
    local_2b0 = '\x05';
    GetScriptForDestination((CScript *)&local_250.indirect_contents,(CTxDestination *)local_2f8);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_2f8);
    ScriptHash::ScriptHash((ScriptHash *)local_318,(CScript *)&local_250.indirect_contents);
    local_2f8._16_4_ = local_318._16_4_;
    local_2f8._0_8_ = local_318._0_8_;
    local_2f8._8_8_ = local_318._8_8_;
    local_2b0 = '\x03';
    GetScriptForDestination((CScript *)local_278,(CTxDestination *)local_2f8);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_2f8);
    local_2f8._16_8_ = 0;
    local_2f8._24_8_ = (pointer)0x0;
    local_2f8._0_8_ = (char *)0x0;
    local_2f8._8_8_ = 0;
    uVar9 = &local_250;
    uVar5 = local_234;
    if (0x1c < local_234) {
      uVar9 = local_250.indirect_contents.indirect;
      uVar5 = local_234 - 0x1d;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_318,
               (const_iterator)uVar9,(uchar *)(uVar9 + (long)(int)uVar5),
               (allocator_type *)&local_338.indirect_contents);
    b_04._M_extent._M_extent_value = local_318._8_8_ - local_318._0_8_;
    b_04._M_ptr = (pointer)local_318._0_8_;
    ppVar7 = &CScript::operator<<((CScript *)local_2f8,b_04)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_250.indirect_contents,
               ppVar7);
    if ((pointer)local_318._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ - local_318._0_8_);
    }
    if (0x1c < (uint)local_2f8._28_4_) {
      free((void *)local_2f8._0_8_);
      local_2f8._0_8_ = (char *)0x0;
    }
    local_318._0_8_ = (pointer)0x0;
    local_318._8_8_ = (pointer)0x0;
    local_318._16_8_ = (pointer)0x0;
    local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)local_318,(int *)local_2f8);
    local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)local_318,(int *)local_2f8);
    BuildTxs(&local_3a8,&local_1e8,&local_370,(CScript *)local_278,
             (CScript *)&local_250.indirect_contents,(CScriptWitness *)local_318);
    CTransaction::CTransaction((CTransaction *)local_2f8,&local_3a8);
    iVar8 = GetTransactionSigOpCost((CTransaction *)local_2f8,&local_1e8,0x801);
    if (iVar8 != 1) {
      __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xc2,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
    CTransaction::CTransaction((CTransaction *)local_2f8,&local_370);
    SVar4 = VerifyWithFlag((CTransaction *)local_2f8,&local_3a8,flags_02);
    if (SVar4 != SCRIPT_ERR_EQUALVERIFY) {
      __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_EQUALVERIFY"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xc3,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_318);
    if (0x1c < uStack_25c) {
      free((void *)local_278._0_8_);
      local_278._0_8_ = (pointer)0x0;
    }
    if (0x1c < local_234) {
      free(local_250.indirect_contents.indirect);
      local_250.indirect_contents.indirect = (char *)0x0;
    }
    local_2f8._16_8_ = 0;
    local_2f8._24_8_ = (pointer)0x0;
    local_2f8._0_8_ = (char *)0x0;
    local_2f8._8_8_ = 0;
    local_278[0] = 0x51;
    prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
              ((prevector<28u,unsigned_char,unsigned_int,int> *)local_2f8,local_278);
    ToByteVector<CPubKey>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278,&local_229);
    b_05._M_extent._M_extent_value = local_278._8_8_ - local_278._0_8_;
    b_05._M_ptr = (pointer)local_278._0_8_;
    pCVar6 = CScript::operator<<((CScript *)local_2f8,b_05);
    ToByteVector<CPubKey>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_318,&local_229);
    b_06._M_extent._M_extent_value = local_318._8_8_ - local_318._0_8_;
    b_06._M_ptr = (pointer)local_318._0_8_;
    ppVar7 = &CScript::operator<<(pCVar6,b_06)->super_CScriptBase;
    local_338.direct[0] = 'R';
    prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
              ((prevector<28u,unsigned_char,unsigned_int,int> *)ppVar7,(uchar *)local_338.direct);
    uVar5 = ppVar7->_size;
    uVar1 = uVar5 - 0x1d;
    if (uVar5 < 0x1d) {
      uVar1 = uVar5;
    }
    ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
              (ppVar7->_union).indirect_contents.indirect;
    if (uVar5 < 0x1d) {
      ppVar11 = ppVar7;
    }
    local_338.direct[0] = 0xaf;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (ppVar7,(uchar *)((long)&ppVar11->_union + (long)(int)uVar1),(uchar *)local_338.direct
              );
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_250.indirect_contents,
               ppVar7);
    if ((pointer)local_318._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ - local_318._0_8_);
    }
    if ((pointer)local_278._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ - local_278._0_8_);
    }
    if (0x1c < (uint)local_2f8._28_4_) {
      free((void *)local_2f8._0_8_);
      local_2f8._0_8_ = (char *)0x0;
    }
    WitnessV0ScriptHash::WitnessV0ScriptHash
              ((WitnessV0ScriptHash *)local_318,(CScript *)&local_250.indirect_contents);
    local_2f8._16_8_ = local_318._16_8_;
    local_2f8._24_8_ = uStack_300;
    local_2f8._0_8_ = local_318._0_8_;
    local_2f8._8_8_ = local_318._8_8_;
    local_2b0 = '\x04';
    GetScriptForDestination((CScript *)local_278,(CTxDestination *)local_2f8);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_2f8);
    local_318._16_8_ = (pointer)0x0;
    uStack_300 = (pointer)0x0;
    local_318._0_8_ = (pointer)0x0;
    local_318._8_8_ = (pointer)0x0;
    local_338.indirect_contents.indirect = (char *)0x0;
    local_338._8_8_ = 0;
    local_338._16_8_ = 0;
    local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_338.indirect_contents,(int *)local_2f8);
    local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_338.indirect_contents,(int *)local_2f8);
    local_2f8._0_8_ = &local_250;
    if (0x1c < local_234) {
      local_2f8._0_8_ = local_250.indirect_contents.indirect;
    }
    uVar5 = local_234 - 0x1d;
    if (0x1c >= local_234) {
      uVar5 = local_234;
    }
    local_3d8.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)&((CScriptBase *)
                          &((anon_struct_12_2_7229fdc5_for_indirect_contents *)local_2f8._0_8_)->
                           indirect)->_union + (long)(int)uVar5);
    std::
    vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::
    emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
              ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                *)&local_338.indirect_contents,(iterator *)local_2f8,(iterator *)&local_3d8);
    BuildTxs(&local_3a8,&local_1e8,&local_370,(CScript *)local_278,(CScript *)local_318,
             (CScriptWitness *)&local_338.indirect_contents);
    CTransaction::CTransaction((CTransaction *)local_2f8,&local_3a8);
    iVar8 = GetTransactionSigOpCost((CTransaction *)local_2f8,&local_1e8,0x801);
    if (iVar8 != 2) {
      __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xd1,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
    CTransaction::CTransaction((CTransaction *)local_2f8,&local_3a8);
    iVar8 = GetTransactionSigOpCost((CTransaction *)local_2f8,&local_1e8,1);
    if (iVar8 != 0) {
      __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags & ~SCRIPT_VERIFY_WITNESS) == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xd2,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
    CTransaction::CTransaction((CTransaction *)local_2f8,&local_370);
    SVar4 = VerifyWithFlag((CTransaction *)local_2f8,&local_3a8,flags_03);
    if (SVar4 != SCRIPT_ERR_CHECKMULTISIGVERIFY) {
      __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xd3,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)&local_338.indirect_contents);
    if (0x1c < uStack_300._4_4_) {
      free((void *)local_318._0_8_);
      local_318._0_8_ = (pointer)0x0;
    }
    if (0x1c < uStack_25c) {
      free((void *)local_278._0_8_);
      local_278._0_8_ = (pointer)0x0;
    }
    if (0x1c < local_234) {
      free(local_250.indirect_contents.indirect);
      local_250.indirect_contents.indirect = (char *)0x0;
    }
    local_2f8._16_8_ = 0;
    local_2f8._24_8_ = (pointer)0x0;
    local_2f8._0_8_ = (char *)0x0;
    local_2f8._8_8_ = 0;
    local_278[0] = 0x51;
    prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
              ((prevector<28u,unsigned_char,unsigned_int,int> *)local_2f8,local_278);
    ToByteVector<CPubKey>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278,&local_229);
    b_07._M_extent._M_extent_value = local_278._8_8_ - local_278._0_8_;
    b_07._M_ptr = (pointer)local_278._0_8_;
    pCVar6 = CScript::operator<<((CScript *)local_2f8,b_07);
    ToByteVector<CPubKey>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_318,&local_229);
    b_08._M_extent._M_extent_value = local_318._8_8_ - local_318._0_8_;
    b_08._M_ptr = (pointer)local_318._0_8_;
    ppVar7 = &CScript::operator<<(pCVar6,b_08)->super_CScriptBase;
    local_338.direct[0] = 'R';
    prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
              ((prevector<28u,unsigned_char,unsigned_int,int> *)ppVar7,(uchar *)local_338.direct);
    uVar5 = ppVar7->_size;
    uVar1 = uVar5 - 0x1d;
    if (uVar5 < 0x1d) {
      uVar1 = uVar5;
    }
    ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
              (ppVar7->_union).indirect_contents.indirect;
    if (uVar5 < 0x1d) {
      ppVar11 = ppVar7;
    }
    local_338.direct[0] = 0xaf;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (ppVar7,(uchar *)((long)&ppVar11->_union + (long)(int)uVar1),(uchar *)local_338.direct
              );
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_250.indirect_contents,
               ppVar7);
    if ((pointer)local_318._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ - local_318._0_8_);
    }
    if ((pointer)local_278._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ - local_278._0_8_);
    }
    if (0x1c < (uint)local_2f8._28_4_) {
      free((void *)local_2f8._0_8_);
      local_2f8._0_8_ = (char *)0x0;
    }
    WitnessV0ScriptHash::WitnessV0ScriptHash
              ((WitnessV0ScriptHash *)local_318,(CScript *)&local_250.indirect_contents);
    local_2f8._16_8_ = local_318._16_8_;
    local_2f8._24_8_ = uStack_300;
    local_2f8._0_8_ = local_318._0_8_;
    local_2f8._8_8_ = local_318._8_8_;
    local_2b0 = '\x04';
    GetScriptForDestination((CScript *)local_278,(CTxDestination *)local_2f8);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_2f8);
    ScriptHash::ScriptHash((ScriptHash *)&local_338.indirect_contents,(CScript *)local_278);
    local_2f8._16_4_ = local_338._16_4_;
    local_2f8._0_8_ = local_338.indirect_contents.indirect;
    local_2f8._8_8_ = local_338._8_8_;
    local_2b0 = '\x03';
    GetScriptForDestination((CScript *)local_318,(CTxDestination *)local_2f8);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_2f8);
    local_2f8._16_8_ = 0;
    local_2f8._24_8_ = (pointer)0x0;
    local_2f8._0_8_ = (char *)0x0;
    local_2f8._8_8_ = 0;
    __first.ptr = (uchar *)local_278;
    uVar5 = uStack_25c;
    if (0x1c < uStack_25c) {
      __first.ptr = (uchar *)local_278._0_8_;
      uVar5 = uStack_25c - 0x1d;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_3d8,__first,
               (const_iterator)(__first.ptr + (int)uVar5),(allocator_type *)&local_3e0);
    b_09._M_extent._M_extent_value =
         (long)local_3d8.stack.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_3d8.stack.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    b_09._M_ptr = (pointer)local_3d8.stack.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    ppVar7 = &CScript::operator<<((CScript *)local_2f8,b_09)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_338.indirect_contents,
               ppVar7);
    if (local_3d8.stack.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3d8.stack.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3d8.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3d8.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (0x1c < (uint)local_2f8._28_4_) {
      free((void *)local_2f8._0_8_);
      local_2f8._0_8_ = (char *)0x0;
    }
    local_3d8.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3d8.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3d8.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<int>(&local_3d8.stack,(int *)local_2f8);
    local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<int>(&local_3d8.stack,(int *)local_2f8);
    local_2f8._0_8_ = &local_250;
    if (0x1c < local_234) {
      local_2f8._0_8_ = local_250.indirect_contents.indirect;
    }
    uVar5 = local_234 - 0x1d;
    if (0x1c >= local_234) {
      uVar5 = local_234;
    }
    local_3e0.ptr =
         (uchar *)((long)&((CScriptBase *)
                          &((anon_struct_12_2_7229fdc5_for_indirect_contents *)local_2f8._0_8_)->
                           indirect)->_union + (long)(int)uVar5);
    std::
    vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::
    emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
              ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                *)&local_3d8,(iterator *)local_2f8,&local_3e0);
    BuildTxs(&local_3a8,&local_1e8,&local_370,(CScript *)local_318,
             (CScript *)&local_338.indirect_contents,&local_3d8);
    CTransaction::CTransaction((CTransaction *)local_2f8,&local_3a8);
    iVar8 = GetTransactionSigOpCost((CTransaction *)local_2f8,&local_1e8,0x801);
    if (iVar8 != 2) {
      __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xe2,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
    CTransaction::CTransaction((CTransaction *)local_2f8,&local_370);
    SVar4 = VerifyWithFlag((CTransaction *)local_2f8,&local_3a8,flags_04);
    if (SVar4 != SCRIPT_ERR_CHECKMULTISIGVERIFY) {
      __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xe3,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_2f8 + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2f8);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector(&local_3d8.stack);
    if (0x1c < local_31c) {
      free(local_338.indirect_contents.indirect);
      local_338.indirect_contents.indirect = (char *)0x0;
    }
    if (0x1c < uStack_300._4_4_) {
      free((void *)local_318._0_8_);
      local_318._0_8_ = (pointer)0x0;
    }
    if (0x1c < uStack_25c) {
      free((void *)local_278._0_8_);
      local_278._0_8_ = (pointer)0x0;
    }
    if (0x1c < local_234) {
      free(local_250.indirect_contents.indirect);
      local_250.indirect_contents.indirect = (char *)0x0;
    }
    if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )local_3b8._M_t.
          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
        (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_3b8,
                 (array<unsigned_char,_32UL> *)
                 local_3b8._M_t.
                 super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
    }
    local_1e8.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
         (_func_int **)&PTR_GetCoin_013bb490;
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_1e8.cacheCoins._M_h);
    if (local_1e8.m_sentinel.second.m_flags != '\0') {
      ((local_1e8.m_sentinel.second.m_next)->second).m_prev = local_1e8.m_sentinel.second.m_prev;
      ((local_1e8.m_sentinel.second.m_prev)->second).m_next = local_1e8.m_sentinel.second.m_next;
      local_1e8.m_sentinel.second.m_flags = '\0';
    }
    if (0x1c < local_1e8.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
      free(local_1e8.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.
           indirect_contents.indirect);
      local_1e8.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
      indirect = (char *)0x0;
    }
    PoolResource<144UL,_8UL>::~PoolResource(&local_1e8.m_cache_coins_memory_resource);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_3a8.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_3a8.vin);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_370.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_370.vin);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                ,0xb5,"void sigopcount_tests::GetTxSigOpCost::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(GetTxSigOpCost)
{
    // Transaction creates outputs
    CMutableTransaction creationTx;
    // Transaction that spends outputs and whose
    // sig op cost is going to be tested
    CMutableTransaction spendingTx;

    // Create utxo set
    CCoinsView coinsDummy;
    CCoinsViewCache coins(&coinsDummy);
    // Create key
    CKey key = GenerateRandomKey();
    CPubKey pubkey = key.GetPubKey();
    // Default flags
    const uint32_t flags{SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH};

    // Multisig script (legacy counting)
    {
        CScript scriptPubKey = CScript() << 1 << ToByteVector(pubkey) << ToByteVector(pubkey) << 2 << OP_CHECKMULTISIGVERIFY;
        // Do not use a valid signature to avoid using wallet operations.
        CScript scriptSig = CScript() << OP_0 << OP_0;

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, CScriptWitness());
        // Legacy counting only includes signature operations in scriptSigs and scriptPubKeys
        // of a transaction and does not take the actual executed sig operations into account.
        // spendingTx in itself does not contain a signature operation.
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0);
        // creationTx contains two signature operations in its scriptPubKey, but legacy counting
        // is not accurate.
        assert(GetTransactionSigOpCost(CTransaction(creationTx), coins, flags) == MAX_PUBKEYS_PER_MULTISIG * WITNESS_SCALE_FACTOR);
        // Sanity check: script verification fails because of an invalid signature.
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY);
    }

    // Multisig nested in P2SH
    {
        CScript redeemScript = CScript() << 1 << ToByteVector(pubkey) << ToByteVector(pubkey) << 2 << OP_CHECKMULTISIGVERIFY;
        CScript scriptPubKey = GetScriptForDestination(ScriptHash(redeemScript));
        CScript scriptSig = CScript() << OP_0 << OP_0 << ToByteVector(redeemScript);

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, CScriptWitness());
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2 * WITNESS_SCALE_FACTOR);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY);
    }

    // P2WPKH witness program
    {
        CScript scriptPubKey = GetScriptForDestination(WitnessV0KeyHash(pubkey));
        CScript scriptSig = CScript();
        CScriptWitness scriptWitness;
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(0);


        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 1);
        // No signature operations if we don't verify the witness.
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags & ~SCRIPT_VERIFY_WITNESS) == 0);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_EQUALVERIFY);

        // The sig op cost for witness version != 0 is zero.
        assert(scriptPubKey[0] == 0x00);
        scriptPubKey[0] = 0x51;
        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0);
        scriptPubKey[0] = 0x00;
        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);

        // The witness of a coinbase transaction is not taken into account.
        spendingTx.vin[0].prevout.SetNull();
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0);
    }

    // P2WPKH nested in P2SH
    {
        CScript scriptSig = GetScriptForDestination(WitnessV0KeyHash(pubkey));
        CScript scriptPubKey = GetScriptForDestination(ScriptHash(scriptSig));
        scriptSig = CScript() << ToByteVector(scriptSig);
        CScriptWitness scriptWitness;
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(0);

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 1);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_EQUALVERIFY);
    }

    // P2WSH witness program
    {
        CScript witnessScript = CScript() << 1 << ToByteVector(pubkey) << ToByteVector(pubkey) << 2 << OP_CHECKMULTISIGVERIFY;
        CScript scriptPubKey = GetScriptForDestination(WitnessV0ScriptHash(witnessScript));
        CScript scriptSig = CScript();
        CScriptWitness scriptWitness;
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(witnessScript.begin(), witnessScript.end());

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags & ~SCRIPT_VERIFY_WITNESS) == 0);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY);
    }

    // P2WSH nested in P2SH
    {
        CScript witnessScript = CScript() << 1 << ToByteVector(pubkey) << ToByteVector(pubkey) << 2 << OP_CHECKMULTISIGVERIFY;
        CScript redeemScript = GetScriptForDestination(WitnessV0ScriptHash(witnessScript));
        CScript scriptPubKey = GetScriptForDestination(ScriptHash(redeemScript));
        CScript scriptSig = CScript() << ToByteVector(redeemScript);
        CScriptWitness scriptWitness;
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(witnessScript.begin(), witnessScript.end());

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY);
    }
}